

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_castingOnRetrieval_Test::~Annotator_castingOnRetrieval_Test
          (Annotator_castingOnRetrieval_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, castingOnRetrieval)
{
    std::vector<std::string> idList = {
        "component_1",
        "component_ref_1",
        "connection_1",
        "encapsulation_1",
        "import_1",
        "map_variables_1",
        "model_1",
        "reset_1",
        "reset_value_1",
        "test_value_1",
        "unit_1",
        "units_1",
        "variable_1",
    };
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();
    annotator->setModel(model);

    libcellml::AnyCellmlElementPtr itemInfo;

    libcellml::VariablePairPtr v1v2;
    libcellml::ComponentPtr c1;
    libcellml::ComponentPtr c2;

    for (auto const &id : idList) {
        itemInfo = annotator->item(id);
        switch (itemInfo->type()) {
        case libcellml::CellmlElementType::COMPONENT:
            EXPECT_EQ(model->component("component1"), itemInfo->component());
            break;
        case libcellml::CellmlElementType::COMPONENT_REF:
            EXPECT_EQ(model->component("component2"), itemInfo->component());
            break;
        case libcellml::CellmlElementType::CONNECTION:
            v1v2 = itemInfo->variablePair();
            c1 = owningComponent(v1v2->variable1());
            c2 = owningComponent(v1v2->variable2());
            EXPECT_TRUE((model->component("component2") == c1) || (model->component("component2") == c2));
            EXPECT_TRUE((model->component("component2")->component("component3") == c1) || (model->component("component2")->component("component3") == c2));
            break;
        case libcellml::CellmlElementType::ENCAPSULATION:
            EXPECT_EQ(model, itemInfo->model());
            break;
        case libcellml::CellmlElementType::IMPORT:
            EXPECT_EQ(model->component("component1")->importSource(), itemInfo->importSource());
            break;
        case libcellml::CellmlElementType::MAP_VARIABLES:
            v1v2 = itemInfo->variablePair();
            EXPECT_TRUE((v1v2->variable1() == model->component("component2")->variable("variable1")) || (v1v2->variable1() == model->component("component2")->component("component3")->variable("variable1")));
            EXPECT_TRUE((v1v2->variable2() == model->component("component2")->variable("variable1")) || (v1v2->variable2() == model->component("component2")->component("component3")->variable("variable1")));
            break;
        case libcellml::CellmlElementType::MODEL:
            EXPECT_EQ(model, itemInfo->model());
            break;
        case libcellml::CellmlElementType::RESET:
            EXPECT_EQ(model->component("component2")->reset(0), itemInfo->reset());
            break;
        case libcellml::CellmlElementType::RESET_VALUE:
            EXPECT_EQ(model->component("component2")->reset(0), itemInfo->reset());
            break;
        case libcellml::CellmlElementType::TEST_VALUE:
            EXPECT_EQ(model->component("component2")->reset(0), itemInfo->reset());
            break;
        case libcellml::CellmlElementType::UNIT:
            EXPECT_EQ(model->units("units2"), itemInfo->unitsItem()->units());
            EXPECT_EQ(size_t(0), itemInfo->unitsItem()->index());
            break;
        case libcellml::CellmlElementType::UNITS:
            EXPECT_EQ(model->units("units1"), itemInfo->units());
            break;
        case libcellml::CellmlElementType::VARIABLE:
            EXPECT_EQ(model->component("component2")->variable("variable1"), itemInfo->variable());
            break;
        case libcellml::CellmlElementType::MATH:
        case libcellml::CellmlElementType::UNDEFINED:
            break;
        }
    }
}